

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::GenerateFindDependencyCalls(cmExportFileGenerator *this,ostream *os)

{
  cmGeneratorTarget *this_00;
  pointer pbVar1;
  long lVar2;
  pointer ppVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  cmValue cVar6;
  __shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
  *p_Var7;
  mapped_type *pmVar8;
  cmFindPackageCall *pcVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  ostream *poVar12;
  WrapQuotes in_R8D;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>_>
  __i;
  long lVar13;
  pointer ppVar14;
  pointer pbVar15;
  pointer ppVar16;
  string_view str;
  allocator<char> local_b1;
  ostream *local_b0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  packageDependenciesSorted;
  string findPackageName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  packageDependencies;
  
  local_b0 = os;
  std::operator<<(os,"include(CMakeFindDependencyMacro)\n");
  packageDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &packageDependencies._M_t._M_impl.super__Rb_tree_header._M_header;
  packageDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  packageDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  packageDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  packageDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       packageDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar5 = (*this->_vptr_cmExportFileGenerator[0x13])(this);
  if (CONCAT44(extraout_var,iVar5) != 0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
    ::operator=(&packageDependencies._M_t,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
                 *)(CONCAT44(extraout_var,iVar5) + 0x50));
  }
  for (p_Var10 = (this->ExternalTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != &(this->ExternalTargets)._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
    this_00 = *(cmGeneratorTarget **)(p_Var10 + 1);
    findPackageName._M_dataplus._M_p = (pointer)&findPackageName.field_2;
    findPackageName._M_string_length = 0;
    findPackageName.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&packageDependenciesSorted,"EXPORT_FIND_PACKAGE_NAME",&local_b1);
    cVar6 = cmGeneratorTarget::GetProperty(this_00,(string *)&packageDependenciesSorted);
    std::__cxx11::string::~string((string *)&packageDependenciesSorted);
    p_Var7 = (__shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
              *)cmTarget::GetFindPackageStack(this_00->Target);
    std::
    __shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr((__shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    *)&packageDependenciesSorted,p_Var7);
    if ((cVar6.Value == (string *)0x0) || ((cVar6.Value)->_M_string_length == 0)) {
      bVar4 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Empty
                        ((cmConstStack<cmFindPackageCall,_cmFindPackageStack> *)
                         &packageDependenciesSorted);
      if (!bVar4) {
        cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Top
                  ((cmConstStack<cmFindPackageCall,_cmFindPackageStack> *)&packageDependenciesSorted
                  );
        std::__cxx11::string::_M_assign((string *)&findPackageName);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&findPackageName);
    }
    if (findPackageName._M_string_length != 0) {
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
               ::operator[](&packageDependencies,&findPackageName);
      bVar4 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Empty
                        ((cmConstStack<cmFindPackageCall,_cmFindPackageStack> *)
                         &packageDependenciesSorted);
      if (!bVar4) {
        pcVar9 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Top
                           ((cmConstStack<cmFindPackageCall,_cmFindPackageStack> *)
                            &packageDependenciesSorted);
        (pmVar8->FindPackageIndex).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_payload_base<unsigned_int>)((ulong)pcVar9->Index | 0x100000000);
      }
      if (pmVar8->Enabled == Auto) {
        pmVar8->Enabled = On;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &packageDependenciesSorted.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::~string((string *)&findPackageName);
  }
  std::
  vector<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>,std::allocator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>>>
  ::
  vector<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,cmExportSet::PackageDependency>>,void>
            ((vector<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>,std::allocator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>>>
              *)&packageDependenciesSorted,
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>
              )packageDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>
              )&packageDependencies._M_t._M_impl.super__Rb_tree_header,
             (allocator_type *)&findPackageName);
  ppVar3 = packageDependenciesSorted.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar16 = packageDependenciesSorted.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (packageDependenciesSorted.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      packageDependenciesSorted.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar13 = (long)packageDependenciesSorted.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)packageDependenciesSorted.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = lVar13 / 0x50;
    lVar2 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>*,std::vector<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>,std::allocator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmExportFileGenerator::GenerateFindDependencyCalls(std::ostream&)::__0>>
              (packageDependenciesSorted.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               packageDependenciesSorted.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar13 < 0x501) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>*,std::vector<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>,std::allocator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmExportFileGenerator::GenerateFindDependencyCalls(std::ostream&)::__0>>
                (ppVar16,ppVar3);
    }
    else {
      ppVar14 = ppVar16 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>*,std::vector<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>,std::allocator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmExportFileGenerator::GenerateFindDependencyCalls(std::ostream&)::__0>>
                (ppVar16,ppVar14);
      for (; ppVar14 != ppVar3; ppVar14 = ppVar14 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>*,std::vector<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>,std::allocator<std::pair<std::__cxx11::string,cmExportSet::PackageDependency>>>>,__gnu_cxx::__ops::_Val_comp_iter<cmExportFileGenerator::GenerateFindDependencyCalls(std::ostream&)::__0>>
                  (ppVar14);
      }
    }
  }
  for (ppVar16 = packageDependenciesSorted.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppVar16 !=
      packageDependenciesSorted.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppVar16 = ppVar16 + 1) {
    if ((ppVar16->second).Enabled == On) {
      poVar12 = std::operator<<(local_b0,"find_dependency(");
      std::operator<<(poVar12,(string *)ppVar16);
      pbVar1 = (ppVar16->second).ExtraArguments.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar15 = (ppVar16->second).ExtraArguments.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar1;
          pbVar15 = pbVar15 + 1) {
        poVar12 = std::operator<<(local_b0," ");
        str._M_str = (char *)0x0;
        str._M_len = (size_t)(pbVar15->_M_dataplus)._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&findPackageName,(cmOutputConverter *)pbVar15->_M_string_length,str,in_R8D);
        std::operator<<(poVar12,(string *)&findPackageName);
        std::__cxx11::string::~string((string *)&findPackageName);
      }
      std::operator<<(local_b0,")\n");
    }
  }
  std::operator<<(local_b0,"\n\n");
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  ::~vector(&packageDependenciesSorted);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet::PackageDependency>_>_>
  ::~_Rb_tree(&packageDependencies._M_t);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateFindDependencyCalls(std::ostream& os)
{
  os << "include(CMakeFindDependencyMacro)\n";
  std::map<std::string, cmExportSet::PackageDependency> packageDependencies;
  auto* exportSet = this->GetExportSet();
  if (exportSet) {
    packageDependencies = exportSet->GetPackageDependencies();
  }

  for (cmGeneratorTarget const* gt : this->ExternalTargets) {
    std::string findPackageName;
    auto exportFindPackageName = gt->GetProperty("EXPORT_FIND_PACKAGE_NAME");
    cmFindPackageStack pkgStack = gt->Target->GetFindPackageStack();
    if (!exportFindPackageName.IsEmpty()) {
      findPackageName = *exportFindPackageName;
    } else {
      if (!pkgStack.Empty()) {
        cmFindPackageCall const& fpc = pkgStack.Top();
        findPackageName = fpc.Name;
      }
    }
    if (!findPackageName.empty()) {
      auto& dep = packageDependencies[findPackageName];
      if (!pkgStack.Empty()) {
        dep.FindPackageIndex = pkgStack.Top().Index;
      }
      if (dep.Enabled == cmExportSet::PackageDependencyExportEnabled::Auto) {
        dep.Enabled = cmExportSet::PackageDependencyExportEnabled::On;
      }
    }
  }

  std::vector<std::pair<std::string, cmExportSet::PackageDependency>>
    packageDependenciesSorted(packageDependencies.begin(),
                              packageDependencies.end());
  std::sort(
    packageDependenciesSorted.begin(), packageDependenciesSorted.end(),
    [](const std::pair<std::string, cmExportSet::PackageDependency>& lhs,
       const std::pair<std::string, cmExportSet::PackageDependency>& rhs)
      -> bool {
      if (lhs.second.SpecifiedIndex) {
        if (rhs.second.SpecifiedIndex) {
          return lhs.second.SpecifiedIndex < rhs.second.SpecifiedIndex;
        }
        assert(rhs.second.FindPackageIndex);
        return true;
      }
      assert(lhs.second.FindPackageIndex);
      if (rhs.second.SpecifiedIndex) {
        return false;
      }
      assert(rhs.second.FindPackageIndex);
      return lhs.second.FindPackageIndex < rhs.second.FindPackageIndex;
    });

  for (auto const& it : packageDependenciesSorted) {
    if (it.second.Enabled == cmExportSet::PackageDependencyExportEnabled::On) {
      os << "find_dependency(" << it.first;
      for (auto const& arg : it.second.ExtraArguments) {
        os << " " << cmOutputConverter::EscapeForCMake(arg);
      }
      os << ")\n";
    }
  }
  os << "\n\n";
}